

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O3

double __thiscall dbscan::DBSCAN::euclideanDist(DBSCAN *this,_3DPoint *pa,_3DPoint *pb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = pa->m_y - pb->m_y;
  dVar2 = pa->m_x - pb->m_x;
  dVar3 = pa->m_z - pb->m_z;
  return SQRT(dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2);
}

Assistant:

double DBSCAN::euclideanDist(_3DPoint* pa, _3DPoint* pb) {
    return sqrt(
        pow((pa->m_x - pb->m_x), 2) +
        pow((pa->m_y - pb->m_y), 2) +
        pow((pa->m_z - pb->m_z), 2)
    );
}